

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::AllOfMatcherImpl<const_char_&>::DescribeNegationTo
          (AllOfMatcherImpl<const_char_&> *this,ostream *os)

{
  ulong uVar1;
  MatcherBase<const_char_&> *this_00;
  long lVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  this_00 = &((this->matchers_).
              super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->super_MatcherBase<const_char_&>;
  if (&((this->matchers_).
        super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->super_MatcherBase<const_char_&> != this_00) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,") or (",6);
        this_00 = (MatcherBase<const_char_&> *)
                  ((long)&(((this->matchers_).
                            super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_MatcherBase<const_char_&>).super_MatcherDescriberInterface.
                          _vptr_MatcherDescriberInterface + lVar2);
      }
      MatcherBase<const_char_&>::DescribeNegationTo(this_00,os);
      uVar1 = uVar1 + 1;
      this_00 = &((this->matchers_).
                  super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_MatcherBase<const_char_&>;
      lVar2 = lVar2 + 0x18;
    } while (uVar1 < (ulong)(((long)(this->matchers_).
                                    super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3)
                            * -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

void DescribeNegationTo(::std::ostream* os) const override {
    *os << "(";
    for (size_t i = 0; i < matchers_.size(); ++i) {
      if (i != 0) *os << ") or (";
      matchers_[i].DescribeNegationTo(os);
    }
    *os << ")";
  }